

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

Result<wallet::SelectionResult> *
wallet::SelectCoinsBnB
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
          CAmount *selection_target,CAmount *cost_of_change,int max_selection_weight)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pointer puVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  long lVar8;
  CAmount CVar9;
  int iVar10;
  pointer pOVar11;
  iterator __begin1;
  long lVar12;
  pointer puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long in_FS_OFFSET;
  long local_228;
  size_type local_1e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> best_selection;
  vector<unsigned_long,_std::allocator<unsigned_long>_> curr_selection;
  SelectionResult local_198;
  bilingual_str local_128;
  bilingual_str local_e8;
  SelectionResult result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  result.m_target = *selection_target;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  result.m_algo = BNB;
  result.m_use_effective = false;
  result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  result.m_algo_completed = true;
  result.m_weight = 0;
  result.bump_fee_group_discount = 0;
  curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar12 = 0;
  for (pOVar11 = (utxo_pool->
                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      pOVar11 !=
      (utxo_pool->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
      _M_impl.super__Vector_impl_data._M_finish; pOVar11 = pOVar11 + 1) {
    lVar2 = *(long *)((long)&pOVar11->m_value + (ulong)((pOVar11->m_subtract_fee_outputs ^ 1) << 5))
    ;
    if (lVar2 < 1) {
      __assert_fail("utxo.GetSelectionAmount() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
                    ,0x6a,
                    "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                   );
    }
    lVar12 = lVar12 + lVar2;
  }
  if (lVar12 < result.m_target) {
    local_e8.original._M_dataplus._M_p = (pointer)&local_e8.original.field_2;
    local_e8.translated._M_string_length = 0;
    local_e8.translated.field_2._8_8_ = 0;
    local_e8.original.field_2._M_allocated_capacity = 0;
    local_e8.original.field_2._8_8_ = 0;
    local_e8.original._M_string_length = 0;
    local_e8.translated._M_dataplus._M_p = (pointer)&local_e8.translated.field_2;
    local_e8.translated.field_2._M_allocated_capacity = 0;
    std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
               __return_storage_ptr__,&local_e8);
    bilingual_str::~bilingual_str(&local_e8);
  }
  else {
    std::
    sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,wallet::__0>
              ();
    best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar6 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at(utxo_pool,0)
    ;
    lVar2 = pvVar6->fee;
    iVar10 = 0;
    pvVar6 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at(utxo_pool,0)
    ;
    lVar3 = pvVar6->long_term_fee;
    local_228 = 2100000000000000;
    local_1e0 = 0;
    lVar15 = 0;
    bVar5 = false;
    lVar16 = 0;
    for (lVar14 = 0; lVar14 != 100000; lVar14 = lVar14 + 1) {
      lVar8 = *selection_target;
      if (lVar16 + lVar12 < lVar8) {
LAB_002257f0:
        if (curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start ==
            curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish) break;
        while( true ) {
          local_1e0 = local_1e0 - 1;
          if (local_1e0 <=
              curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1]) break;
          pvVar6 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                             (utxo_pool,local_1e0);
          lVar12 = lVar12 + *(long *)((long)&pvVar6->m_value +
                                     (ulong)((pvVar6->m_subtract_fee_outputs ^ 1) << 5));
        }
        if (local_1e0 !=
            curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish[-1]) {
          __assert_fail("utxo_pool_index == curr_selection.back()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
                        ,0x9f,
                        "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                       );
        }
        pvVar6 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                           (utxo_pool,local_1e0);
        lVar16 = lVar16 - *(long *)((long)&pvVar6->m_value +
                                   (ulong)((pvVar6->m_subtract_fee_outputs ^ 1) << 5));
        lVar15 = (lVar15 - pvVar6->fee) + pvVar6->long_term_fee;
        iVar10 = iVar10 - pvVar6->m_weight;
        curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1;
      }
      else {
        if ((*cost_of_change + lVar8 < lVar16) || (local_228 < lVar15 && lVar3 < lVar2))
        goto LAB_002257f0;
        if (max_selection_weight < iVar10) {
          bVar5 = true;
          goto LAB_002257f0;
        }
        if (lVar8 <= lVar16) {
          lVar15 = (lVar16 - lVar8) + lVar15;
          if (lVar15 <= local_228) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (&best_selection,&curr_selection);
            lVar8 = *selection_target;
            local_228 = lVar15;
          }
          lVar15 = (lVar15 - lVar16) + lVar8;
          goto LAB_002257f0;
        }
        pvVar6 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                           (utxo_pool,local_1e0);
        lVar8 = *(long *)((long)&pvVar6->m_value +
                         (ulong)((pvVar6->m_subtract_fee_outputs ^ 1) << 5));
        lVar12 = lVar12 - lVar8;
        if ((curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start ==
             curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish) ||
           (local_1e0 - 1 ==
            curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish[-1])) {
LAB_00225964:
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&curr_selection,&local_1e0);
          lVar16 = lVar16 + *(long *)((long)&pvVar6->m_value +
                                     (ulong)((pvVar6->m_subtract_fee_outputs ^ 1) << 5));
          lVar15 = (lVar15 + pvVar6->fee) - pvVar6->long_term_fee;
          iVar10 = iVar10 + pvVar6->m_weight;
        }
        else {
          pvVar7 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                             (utxo_pool,local_1e0 - 1);
          if (lVar8 != *(long *)((long)&pvVar7->m_value +
                                (ulong)((pvVar7->m_subtract_fee_outputs ^ 1) << 5)))
          goto LAB_00225964;
          lVar8 = pvVar6->fee;
          pvVar7 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                             (utxo_pool,local_1e0 - 1);
          if (lVar8 != pvVar7->fee) goto LAB_00225964;
        }
      }
      local_1e0 = local_1e0 + 1;
    }
    puVar4 = best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (bVar5) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_128.original._M_dataplus._M_p = (pointer)&local_128.original.field_2;
        local_128.translated._M_string_length = 0;
        local_128.translated.field_2._8_8_ = 0;
        local_128.original.field_2._M_allocated_capacity = 0;
        local_128.original.field_2._8_8_ = 0;
        local_128.original._M_string_length = 0;
        local_128.translated._M_dataplus._M_p = (pointer)&local_128.translated.field_2;
        local_128.translated.field_2._M_allocated_capacity = 0;
        std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                   __return_storage_ptr__,&local_128);
        bilingual_str::~bilingual_str(&local_128);
      }
    }
    else {
      for (puVar13 = best_selection.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar13 != puVar4; puVar13 = puVar13 + 1) {
        pvVar6 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                           (utxo_pool,*puVar13);
        SelectionResult::AddInput(&result,pvVar6);
      }
      SelectionResult::RecalculateWaste(&result,*cost_of_change,*cost_of_change,0);
      CVar9 = SelectionResult::GetWaste(&result);
      if (local_228 != CVar9) {
        __assert_fail("best_waste == result.GetWaste()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
                      ,0xc6,
                      "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                     );
      }
      SelectionResult::SelectionResult(&local_198,&result);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
      _Variant_storage<1ul,wallet::SelectionResult>
                ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                 __return_storage_ptr__,&local_198);
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&local_198);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&result);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> SelectCoinsBnB(std::vector<OutputGroup>& utxo_pool, const CAmount& selection_target, const CAmount& cost_of_change,
                                             int max_selection_weight)
{
    SelectionResult result(selection_target, SelectionAlgorithm::BNB);
    CAmount curr_value = 0;
    std::vector<size_t> curr_selection; // selected utxo indexes
    int curr_selection_weight = 0; // sum of selected utxo weight

    // Calculate curr_available_value
    CAmount curr_available_value = 0;
    for (const OutputGroup& utxo : utxo_pool) {
        // Assert that this utxo is not negative. It should never be negative,
        // effective value calculation should have removed it
        assert(utxo.GetSelectionAmount() > 0);
        curr_available_value += utxo.GetSelectionAmount();
    }
    if (curr_available_value < selection_target) {
        return util::Error();
    }

    // Sort the utxo_pool
    std::sort(utxo_pool.begin(), utxo_pool.end(), descending);

    CAmount curr_waste = 0;
    std::vector<size_t> best_selection;
    CAmount best_waste = MAX_MONEY;

    bool is_feerate_high = utxo_pool.at(0).fee > utxo_pool.at(0).long_term_fee;
    bool max_tx_weight_exceeded = false;

    // Depth First search loop for choosing the UTXOs
    for (size_t curr_try = 0, utxo_pool_index = 0; curr_try < TOTAL_TRIES; ++curr_try, ++utxo_pool_index) {
        // Conditions for starting a backtrack
        bool backtrack = false;
        if (curr_value + curr_available_value < selection_target || // Cannot possibly reach target with the amount remaining in the curr_available_value.
            curr_value > selection_target + cost_of_change || // Selected value is out of range, go back and try other branch
            (curr_waste > best_waste && is_feerate_high)) { // Don't select things which we know will be more wasteful if the waste is increasing
            backtrack = true;
        } else if (curr_selection_weight > max_selection_weight) { // Selected UTXOs weight exceeds the maximum weight allowed, cannot find more solutions by adding more inputs
            max_tx_weight_exceeded = true; // at least one selection attempt exceeded the max weight
            backtrack = true;
        } else if (curr_value >= selection_target) {       // Selected value is within range
            curr_waste += (curr_value - selection_target); // This is the excess value which is added to the waste for the below comparison
            // Adding another UTXO after this check could bring the waste down if the long term fee is higher than the current fee.
            // However we are not going to explore that because this optimization for the waste is only done when we have hit our target
            // value. Adding any more UTXOs will be just burning the UTXO; it will go entirely to fees. Thus we aren't going to
            // explore any more UTXOs to avoid burning money like that.
            if (curr_waste <= best_waste) {
                best_selection = curr_selection;
                best_waste = curr_waste;
            }
            curr_waste -= (curr_value - selection_target); // Remove the excess value as we will be selecting different coins now
            backtrack = true;
        }

        if (backtrack) { // Backtracking, moving backwards
            if (curr_selection.empty()) { // We have walked back to the first utxo and no branch is untraversed. All solutions searched
                break;
            }

            // Add omitted UTXOs back to lookahead before traversing the omission branch of last included UTXO.
            for (--utxo_pool_index; utxo_pool_index > curr_selection.back(); --utxo_pool_index) {
                curr_available_value += utxo_pool.at(utxo_pool_index).GetSelectionAmount();
            }

            // Output was included on previous iterations, try excluding now.
            assert(utxo_pool_index == curr_selection.back());
            OutputGroup& utxo = utxo_pool.at(utxo_pool_index);
            curr_value -= utxo.GetSelectionAmount();
            curr_waste -= utxo.fee - utxo.long_term_fee;
            curr_selection_weight -= utxo.m_weight;
            curr_selection.pop_back();
        } else { // Moving forwards, continuing down this branch
            OutputGroup& utxo = utxo_pool.at(utxo_pool_index);

            // Remove this utxo from the curr_available_value utxo amount
            curr_available_value -= utxo.GetSelectionAmount();

            if (curr_selection.empty() ||
                // The previous index is included and therefore not relevant for exclusion shortcut
                (utxo_pool_index - 1) == curr_selection.back() ||
                // Avoid searching a branch if the previous UTXO has the same value and same waste and was excluded.
                // Since the ratio of fee to long term fee is the same, we only need to check if one of those values match in order to know that the waste is the same.
                utxo.GetSelectionAmount() != utxo_pool.at(utxo_pool_index - 1).GetSelectionAmount() ||
                utxo.fee != utxo_pool.at(utxo_pool_index - 1).fee)
            {
                // Inclusion branch first (Largest First Exploration)
                curr_selection.push_back(utxo_pool_index);
                curr_value += utxo.GetSelectionAmount();
                curr_waste += utxo.fee - utxo.long_term_fee;
                curr_selection_weight += utxo.m_weight;
            }
        }
    }

    // Check for solution
    if (best_selection.empty()) {
        return max_tx_weight_exceeded ? ErrorMaxWeightExceeded() : util::Error();
    }

    // Set output set
    for (const size_t& i : best_selection) {
        result.AddInput(utxo_pool.at(i));
    }
    result.RecalculateWaste(cost_of_change, cost_of_change, CAmount{0});
    assert(best_waste == result.GetWaste());

    return result;
}